

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

CURLcode Curl_conn_tcp_accepted_set
                   (Curl_easy *data,connectdata *conn,int sockindex,curl_socket_t *s)

{
  curl_socket_t cVar1;
  uint err;
  Curl_cfilter *cf;
  void *pvVar2;
  void *pvVar3;
  _Bool _Var4;
  int iVar5;
  uint *puVar6;
  char *pcVar7;
  char *fmt;
  curltime cVar8;
  curl_socklen_t plen;
  Curl_sockaddr_storage ssrem;
  char buffer [256];
  
  cf = conn->cfilter[sockindex];
  if (cf == (Curl_cfilter *)0x0) {
    return CURLE_FAILED_INIT;
  }
  if (cf->cft != &Curl_cft_tcp_accept) {
    return CURLE_FAILED_INIT;
  }
  pvVar2 = cf->ctx;
  socket_close(data,conn,1,*(curl_socket_t *)((long)pvVar2 + 0x98));
  cVar1 = *s;
  *(curl_socket_t *)((long)pvVar2 + 0x98) = cVar1;
  conn->sock[sockindex] = cVar1;
  pvVar3 = cf->ctx;
  *(undefined1 *)((long)pvVar3 + 0xe0) = 0;
  *(undefined4 *)((long)pvVar3 + 0x110) = 0;
  plen = 0x80;
  ssrem.buffer._0_8_ = 0;
  ssrem.buffer._8_1_ = '\0';
  ssrem.buffer._9_1_ = '\0';
  ssrem.buffer._10_1_ = '\0';
  ssrem.buffer._11_1_ = '\0';
  ssrem.buffer._12_1_ = '\0';
  ssrem.buffer._13_1_ = '\0';
  ssrem.buffer._14_1_ = '\0';
  ssrem.buffer._15_1_ = '\0';
  ssrem.buffer._16_8_ = 0;
  ssrem.buffer._24_8_ = 0;
  ssrem.buffer._32_8_ = 0;
  ssrem.buffer._40_8_ = 0;
  ssrem.buffer._48_8_ = 0;
  ssrem.buffer._56_8_ = 0;
  ssrem.buffer._64_8_ = 0;
  ssrem.buffer._72_8_ = 0;
  ssrem.buffer._80_8_ = 0;
  ssrem.buffer._88_8_ = 0;
  ssrem.buffer._96_8_ = 0;
  ssrem.buffer._104_8_ = 0;
  ssrem.buffer._112_8_ = 0;
  ssrem.buffer.sa_stor.__ss_align = 0;
  iVar5 = getpeername(*(int *)((long)pvVar3 + 0x98),(sockaddr *)&ssrem,&plen);
  if (iVar5 == 0) {
    _Var4 = Curl_addr2string((sockaddr *)&ssrem,plen,(char *)((long)pvVar3 + 0xe0),
                             (int *)((long)pvVar3 + 0x110));
    if (_Var4) goto LAB_0053194b;
    fmt = "ssrem inet_ntop() failed with errno %d: %s";
  }
  else {
    fmt = "getpeername() failed with errno %d: %s";
  }
  puVar6 = (uint *)__errno_location();
  err = *puVar6;
  pcVar7 = Curl_strerror(err,buffer,0x100);
  Curl_failf(data,fmt,(ulong)err,pcVar7);
LAB_0053194b:
  set_local_ip(cf,data);
  *(byte *)((long)pvVar2 + 0x17c) = *(byte *)((long)pvVar2 + 0x17c) | 10;
  cVar8 = Curl_now();
  *(time_t *)((long)pvVar2 + 0x158) = cVar8.tv_sec;
  *(int *)((long)pvVar2 + 0x160) = cVar8.tv_usec;
  cf->field_0x24 = cf->field_0x24 | 1;
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"accepted_set(sock=%d, remote=%s port=%d)",
                      (ulong)*(uint *)((long)pvVar2 + 0x98),(long)pvVar2 + 0xe0,
                      (ulong)*(uint *)((long)pvVar2 + 0x110));
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_conn_tcp_accepted_set(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int sockindex, curl_socket_t *s)
{
  struct Curl_cfilter *cf = NULL;
  struct cf_socket_ctx *ctx = NULL;

  cf = conn->cfilter[sockindex];
  if(!cf || cf->cft != &Curl_cft_tcp_accept)
    return CURLE_FAILED_INIT;

  ctx = cf->ctx;
  /* discard the listen socket */
  socket_close(data, conn, TRUE, ctx->sock);
  ctx->sock = *s;
  conn->sock[sockindex] = ctx->sock;
  set_accepted_remote_ip(cf, data);
  set_local_ip(cf, data);
  ctx->active = TRUE;
  ctx->accepted = TRUE;
  ctx->connected_at = Curl_now();
  cf->connected = TRUE;
  CURL_TRC_CF(data, cf, "accepted_set(sock=%" CURL_FORMAT_SOCKET_T
              ", remote=%s port=%d)",
              ctx->sock, ctx->r_ip, ctx->r_port);

  return CURLE_OK;
}